

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,vector<long,_std::allocator<long>_> *v)

{
  size_t i;
  ulong uVar1;
  
  std::operator<<(ofs,"[");
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::operator<<(ofs,", ");
    }
    std::ostream::_M_insert<long>((long)ofs);
  }
  std::operator<<(ofs,"]");
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<int64_t> &v) {
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
  // numeric_limits<uint64_t>::digits10 is 19, so 32 should suffice.
  char buf[32];
#endif

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
    tinyusdz::itoa(v[i], buf);
    ofs << buf;
#else
    ofs << v[i];
#endif
  }
  ofs << "]";

  return ofs;
}